

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.cpp
# Opt level: O0

int __thiscall ncnn::Cast::forward(Cast *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  unsigned_short uVar2;
  float *pfVar3;
  unsigned_short *puVar4;
  char *pcVar5;
  long in_RCX;
  long in_RSI;
  long in_RDI;
  float fVar6;
  int i_4;
  float *outptr_4;
  unsigned_short *ptr_4;
  int q_4;
  int i_3;
  unsigned_short *outptr_3;
  float *ptr_3;
  int q_3;
  int i_2;
  float *outptr_2;
  char *ptr_2;
  int q_2;
  int i_1;
  float *outptr_1;
  unsigned_short *ptr_1;
  int q_1;
  int i;
  unsigned_short *outptr;
  float *ptr;
  int q;
  int size;
  size_t out_elemsize;
  int elempack;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffb9c;
  size_t in_stack_fffffffffffffba0;
  int _d;
  Mat *pMVar7;
  int _h;
  undefined8 in_stack_fffffffffffffba8;
  int iVar8;
  Mat *in_stack_fffffffffffffbb0;
  Mat *in_stack_fffffffffffffbb8;
  Allocator *in_stack_fffffffffffffbc0;
  Allocator *in_stack_fffffffffffffbc8;
  int local_3b4;
  Mat local_3b0;
  float *local_368;
  Mat local_360;
  Mat *local_318;
  int local_310;
  int local_30c;
  Mat local_308;
  unsigned_short *local_2c0;
  Mat local_2b8;
  float *local_270;
  int local_268;
  int local_264;
  Mat local_260;
  float *local_218;
  Mat local_210;
  char *local_1c8;
  int local_1c0;
  int local_1bc;
  Mat local_1b8;
  float *local_170;
  Mat local_168;
  unsigned_short *local_120;
  int local_118;
  int local_114;
  Mat local_110;
  unsigned_short *local_c8;
  Mat local_b0;
  float *local_68;
  int local_60;
  int local_5c;
  long local_58;
  int local_4c;
  long local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  if (*(int *)(in_RDI + 0xd0) == *(int *)(in_RDI + 0xd4)) {
    ncnn::Mat::operator=
              ((Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
               in_stack_fffffffffffffb90);
    local_4 = 0;
  }
  else {
    local_2c = *(int *)(in_RSI + 0x2c);
    local_30 = *(int *)(in_RSI + 0x30);
    local_34 = *(int *)(in_RSI + 0x34);
    local_38 = *(int *)(in_RSI + 0x38);
    local_3c = *(int *)(in_RSI + 0x28);
    local_48 = *(long *)(in_RSI + 0x10);
    local_4c = *(int *)(in_RSI + 0x18);
    if (*(int *)(in_RDI + 0xd4) == 1) {
      local_58 = (long)(local_4c << 2);
    }
    else if (*(int *)(in_RDI + 0xd4) == 2) {
      local_58 = (long)(local_4c << 1);
    }
    else if (*(int *)(in_RDI + 0xd4) == 3) {
      local_58 = (long)local_4c;
    }
    else {
      local_58 = local_48;
      if (*(int *)(in_RDI + 0xd4) == 4) {
        local_58 = (long)(local_4c << 1);
      }
    }
    iVar8 = (int)((ulong)in_stack_fffffffffffffba8 >> 0x20);
    if (local_3c == 1) {
      ncnn::Mat::create(in_stack_fffffffffffffbb0,iVar8,in_stack_fffffffffffffba0,
                        in_stack_fffffffffffffb9c,(Allocator *)in_stack_fffffffffffffb90);
    }
    else {
      _h = (int)in_stack_fffffffffffffba8;
      if (local_3c == 2) {
        ncnn::Mat::create(in_stack_fffffffffffffbb0,iVar8,_h,in_stack_fffffffffffffba0,
                          in_stack_fffffffffffffb9c,(Allocator *)in_stack_fffffffffffffb90);
      }
      else {
        _d = (int)(in_stack_fffffffffffffba0 >> 0x20);
        if (local_3c == 3) {
          ncnn::Mat::create(in_stack_fffffffffffffbb0,iVar8,_h,_d,
                            CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                            (int)((ulong)in_stack_fffffffffffffb90 >> 0x20),
                            in_stack_fffffffffffffbc0);
        }
        else if (local_3c == 4) {
          in_stack_fffffffffffffb90 = *(Mat **)(in_RCX + 8);
          ncnn::Mat::create(in_stack_fffffffffffffbb0,iVar8,_h,_d,(int)in_stack_fffffffffffffba0,
                            CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                            (int)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbc8);
        }
      }
    }
    bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffb90);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      local_5c = local_2c * local_30 * local_34 * local_4c;
      if ((*(int *)(in_RDI + 0xd0) == 1) && (*(int *)(in_RDI + 0xd4) == 2)) {
        for (local_60 = 0; local_60 < local_38; local_60 = local_60 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffffbb8,
                             (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
          pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_b0);
          ncnn::Mat::~Mat((Mat *)0x8e632f);
          local_68 = pfVar3;
          ncnn::Mat::channel(in_stack_fffffffffffffbb8,
                             (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
          puVar4 = ncnn::Mat::operator_cast_to_unsigned_short_(&local_110);
          ncnn::Mat::~Mat((Mat *)0x8e6387);
          local_c8 = puVar4;
          for (local_114 = 0; local_114 < local_5c; local_114 = local_114 + 1) {
            uVar2 = float32_to_float16(local_68[local_114]);
            local_c8[local_114] = uVar2;
          }
        }
      }
      if ((*(int *)(in_RDI + 0xd0) == 2) && (*(int *)(in_RDI + 0xd4) == 1)) {
        for (local_118 = 0; local_118 < local_38; local_118 = local_118 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffffbb8,
                             (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
          puVar4 = ncnn::Mat::operator_cast_to_unsigned_short_(&local_168);
          ncnn::Mat::~Mat((Mat *)0x8e64f1);
          local_120 = puVar4;
          ncnn::Mat::channel(in_stack_fffffffffffffbb8,
                             (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
          pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_1b8);
          ncnn::Mat::~Mat((Mat *)0x8e6543);
          local_170 = pfVar3;
          for (local_1bc = 0; local_1bc < local_5c; local_1bc = local_1bc + 1) {
            fVar6 = float16_to_float32(local_120[local_1bc]);
            local_170[local_1bc] = fVar6;
          }
        }
      }
      if ((*(int *)(in_RDI + 0xd0) == 3) && (*(int *)(in_RDI + 0xd4) == 1)) {
        for (local_1c0 = 0; local_1c0 < local_38; local_1c0 = local_1c0 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffffbb8,
                             (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
          pcVar5 = ncnn::Mat::operator_cast_to_signed_char_(&local_210);
          ncnn::Mat::~Mat((Mat *)0x8e66a1);
          local_1c8 = pcVar5;
          ncnn::Mat::channel(in_stack_fffffffffffffbb8,
                             (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
          pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_260);
          ncnn::Mat::~Mat((Mat *)0x8e66ed);
          for (local_264 = 0; local_264 < local_5c; local_264 = local_264 + 1) {
            pfVar3[local_264] = (float)(int)local_1c8[local_264];
          }
          local_218 = pfVar3;
        }
      }
      if ((*(int *)(in_RDI + 0xd0) == 1) && (*(int *)(in_RDI + 0xd4) == 4)) {
        for (local_268 = 0; local_268 < local_38; local_268 = local_268 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffffbb8,
                             (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
          pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_2b8);
          ncnn::Mat::~Mat((Mat *)0x8e6847);
          pMVar7 = &local_308;
          local_270 = pfVar3;
          ncnn::Mat::channel(in_stack_fffffffffffffbb8,
                             (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
          puVar4 = ncnn::Mat::operator_cast_to_unsigned_short_(pMVar7);
          ncnn::Mat::~Mat((Mat *)0x8e6893);
          local_2c0 = puVar4;
          for (local_30c = 0; local_30c < local_5c; local_30c = local_30c + 1) {
            uVar2 = float32_to_bfloat16(local_270[local_30c]);
            local_2c0[local_30c] = uVar2;
          }
        }
      }
      if ((*(int *)(in_RDI + 0xd0) == 4) && (*(int *)(in_RDI + 0xd4) == 1)) {
        for (local_310 = 0; local_310 < local_38; local_310 = local_310 + 1) {
          pMVar7 = &local_360;
          ncnn::Mat::channel(in_stack_fffffffffffffbb8,(int)((ulong)pMVar7 >> 0x20));
          in_stack_fffffffffffffbb8 = (Mat *)ncnn::Mat::operator_cast_to_unsigned_short_(pMVar7);
          iVar8 = (int)((ulong)pMVar7 >> 0x20);
          ncnn::Mat::~Mat((Mat *)0x8e69f1);
          pMVar7 = &local_3b0;
          local_318 = in_stack_fffffffffffffbb8;
          ncnn::Mat::channel(in_stack_fffffffffffffbb8,iVar8);
          pfVar3 = ncnn::Mat::operator_cast_to_float_(pMVar7);
          ncnn::Mat::~Mat((Mat *)0x8e6a3d);
          local_368 = pfVar3;
          for (local_3b4 = 0; local_3b4 < local_5c; local_3b4 = local_3b4 + 1) {
            fVar6 = bfloat16_to_float32(*(unsigned_short *)
                                         ((long)&local_318->data + (long)local_3b4 * 2));
            local_368[local_3b4] = fVar6;
          }
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Cast::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = float32_to_float16(ptr[i]);
            }
        }
    }

    if (type_from == 2 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = float16_to_float32(ptr[i]);
            }
        }
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = float32_to_bfloat16(ptr[i]);
            }
        }
    }

    if (type_from == 4 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = bfloat16_to_float32(ptr[i]);
            }
        }
    }

    // TODO more cast type

    return 0;
}